

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

Z80Reg Z80::OpCode_CbFamily(int baseOpcode,int *e,bool canHaveDstRegForIxy)

{
  bool bVar1;
  Z80Reg ZVar2;
  Z80Reg reg;
  bool canHaveDstRegForIxy_local;
  int *e_local;
  int baseOpcode_local;
  
  e_local._4_4_ = GetRegister(&::lp);
  if ((uint)e_local._4_4_ < 8) {
    *e = 0xcb;
    e[1] = baseOpcode + e_local._4_4_;
    e_local._4_4_ = Z80_A;
  }
  else if ((e_local._4_4_ == Z80_MEM_IX) || (e_local._4_4_ == Z80_MEM_IY)) {
    *e = e_local._4_4_ & 0xff;
    e[1] = 0xcb;
    e[2] = GetRegister_lastIxyD;
    e[3] = baseOpcode + (e_local._4_4_ >> 8);
    if ((canHaveDstRegForIxy) && (bVar1 = comma(&::lp), bVar1)) {
      ZVar2 = GetRegister(&::lp);
      if (((uint)ZVar2 < 6) || (ZVar2 == Z80_A)) {
        e[3] = baseOpcode + ZVar2;
      }
      else {
        Error("Illegal destination register",::line,PASS3);
      }
    }
    e_local._4_4_ = Z80_A;
  }
  return e_local._4_4_;
}

Assistant:

static Z80Reg OpCode_CbFamily(const int baseOpcode, int* e, bool canHaveDstRegForIxy = true) {
		Z80Reg reg;
		switch (reg = GetRegister(lp)) {
		case Z80_B: case Z80_C: case Z80_D: case Z80_E:
		case Z80_H: case Z80_L: case Z80_MEM_HL: case Z80_A:
			e[0] = 0xcb; e[1] = baseOpcode + reg;
			return Z80_A;
		case Z80_MEM_IX: case Z80_MEM_IY:
			e[0] = reg&0xFF; e[1] = 0xcb; e[2] = GetRegister_lastIxyD; e[3] = baseOpcode + (reg>>8);
			if (canHaveDstRegForIxy && comma(lp)) {
				switch (reg = GetRegister(lp)) {
				case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L: case Z80_A:
					e[3] = baseOpcode + reg;
					break;
				default:
					Error("Illegal destination register", line);
				}
			}
			return Z80_A;
		default: break;
		}
		return reg;
	}